

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2_gmv.c
# Opt level: O0

void iep2_update_gmv(iep2_api_ctx *ctx,mv_list *mv_ls)

{
  uint32_t uVar1;
  uint32_t uVar2;
  char cVar3;
  int iVar4;
  iep2_output *bin_00;
  int8_t x;
  uint32_t r;
  int map [56];
  uint local_30;
  int i;
  int lbin;
  uint32_t *bin;
  int cols;
  int rows;
  mv_list *mv_ls_local;
  iep2_api_ctx *ctx_local;
  
  uVar1 = (ctx->params).tile_rows;
  uVar2 = (ctx->params).tile_cols;
  bin_00 = &ctx->output;
  for (local_30 = 0; (int)local_30 < 0x38; local_30 = local_30 + 1) {
    if ((bin_00->mv_hist[(int)local_30] != 0) && ((iep_debug & 2) != 0)) {
      _mpp_log_l(4,"iep2","iep:mv(%d) %d\n",(char *)0x0,(ulong)(local_30 - 0x1c),
                 (ulong)bin_00->mv_hist[(int)local_30]);
    }
  }
  (ctx->output).mv_hist[0x1c] = 0;
  iep2_sort(bin_00->mv_hist,(int *)&stack0xfffffffffffffee8,0x38);
  if ((iep_debug & 2) != 0) {
    _mpp_log_l(4,"iep2","iep:sort map:\n",(char *)0x0);
  }
  memset((ctx->params).mv_tru_list,0,8);
  memset((ctx->params).mv_tru_vld,0,0x20);
  local_30 = 0;
  do {
    if (7 < (int)local_30) {
LAB_001a4c25:
      for (local_30 = 0; (int)local_30 < 8; local_30 = local_30 + 1) {
        if ((iep_debug & 2) != 0) {
          _mpp_log_l(4,"iep2","iep:new mv candidates list[%d] (%d,%d) %d\n",(char *)0x0,
                     (ulong)local_30,(ulong)(uint)(int)(ctx->params).mv_tru_list[(int)local_30],0,
                     (ctx->params).mv_tru_vld[(int)local_30]);
        }
      }
      return;
    }
    cVar3 = (char)*(undefined4 *)(&stack0xfffffffffffffee8 + (long)(int)local_30 * 4) + -0x1c;
    if ((bin_00->mv_hist[*(int *)(&stack0xfffffffffffffee8 + (long)(int)local_30 * 4)] <=
         (uint)(((int)(uVar1 * uVar2) >> 7) * 6)) &&
       (iVar4 = iep2_is_subt_mv((int)cVar3,mv_ls), iVar4 == 0)) {
      if (local_30 == 0) {
        (ctx->params).mv_tru_list[0] = '\0';
        (ctx->params).mv_tru_vld[0] = 1;
      }
      goto LAB_001a4c25;
    }
    (ctx->params).mv_tru_list[(int)local_30] = cVar3;
    (ctx->params).mv_tru_vld[(int)local_30] = 1;
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void iep2_update_gmv(struct iep2_api_ctx *ctx, struct mv_list *mv_ls)
{
    int rows = ctx->params.tile_rows;
    int cols = ctx->params.tile_cols;
    uint32_t *bin = ctx->output.mv_hist;
    int lbin = MPP_ARRAY_ELEMS(ctx->output.mv_hist);
    int i;

    int map[MPP_ARRAY_ELEMS(ctx->output.mv_hist)];

    uint32_t r = 6;

    // print mvc histogram of current motion estimation.
    for (i = 0; i < lbin; ++i) {
        if (bin[i] == 0)
            continue;
        iep_dbg_trace("mv(%d) %d\n", i - MVL, bin[i]);
    }

    bin[MVL] = 0; // disable 0 mv

    // update motion vector candidates
    iep2_sort(bin, map, lbin);

    iep_dbg_trace("sort map:\n");
    if (0) {
        for (i = 0; i < lbin; ++i) {
            fprintf(stderr, "%d ", map[i]);
        }
        fprintf(stderr, "\n");
    }

    memset(ctx->params.mv_tru_list, 0, sizeof(ctx->params.mv_tru_list));
    memset(ctx->params.mv_tru_vld, 0, sizeof(ctx->params.mv_tru_vld));

    // Get top 8 candidates of current motion estimation.
    for (i = 0; i < 8; ++i) {
        int8_t x = map[i] - MVL;

        if (bin[map[i]] > r * ((rows * cols) >> 7) ||
            iep2_is_subt_mv(x, mv_ls)) {

            // 1 bit at low endian for mv valid check
            ctx->params.mv_tru_list[i] = x;
            ctx->params.mv_tru_vld[i] = 1;
        } else {
            if (i == 0) {
                ctx->params.mv_tru_list[0] = 0;
                ctx->params.mv_tru_vld[0] = 1;
            }
            break;
        }
    }

    for (i = 0; i < 8; ++i)
        iep_dbg_trace("new mv candidates list[%d] (%d,%d) %d\n",
                      i, ctx->params.mv_tru_list[i], 0, ctx->params.mv_tru_vld[i]);
}